

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O0

int feederBig2(void)

{
  int iVar1;
  DWORD DVar2;
  int iVar3;
  DWORD DVar4;
  uint uVar5;
  FILE *__stream;
  int local_24;
  int j;
  DWORD t;
  int i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    printf("Creating a large graph...");
    fflush(_stdout);
    DVar2 = GetTickCount();
    fprintf(__stream,"5000\n1 2\n%d\n",0xbeb25b);
    for (j = 0; iVar1 = j, j + 1 < 5000; j = j + 1) {
      while (iVar3 = iVar1, local_24 = iVar3 + 1, local_24 < 5000) {
        if (((((j != 0) && (j != 1)) && (j != 0x7c0)) ||
            (((iVar1 = local_24, local_24 != 0 && (iVar1 = local_24, local_24 != 1)) &&
             (iVar1 = local_24, local_24 != 0x7c0)))) &&
           (iVar3 = fprintf(__stream,"%d %d 2\n",(ulong)(j + 1),(ulong)(iVar3 + 2)),
           iVar1 = local_24, iVar3 < 2)) {
          printf("can\'t create in.txt. No space on disk?\n");
          fclose(__stream);
          return -1;
        }
      }
    }
    fprintf(__stream,"1 1985 1\n");
    fprintf(__stream,"2 1985 1\n");
    fclose(__stream);
    DVar4 = GetTickCount();
    uVar5 = RoundUptoThousand(DVar4 - DVar2);
    printf("done in T=%u seconds. Starting exe with timeout T+6... ",(ulong)uVar5 / 1000,
           (ulong)uVar5 % 1000);
    LabTimeout = uVar5 + 6000;
    fflush(_stdout);
    LabMemoryLimit = 0x635e100;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig2(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    DWORD t;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating a large graph...");
    fflush(stdout);
    t = GetTickCount();

    fprintf(in, "5000\n1 2\n%d\n", 5000*4999/2-1);
    for (i = 0; i+1 < 5000; i++) {
        int j;
        for (j = i+1; j < 5000; j++) {
            if ((i == 0 || i == 1 || i == 1984) && (j == 0 || j == 1 || j == 1984)) {
                continue;
            }
            if (fprintf(in, "%d %d 2\n", i+1, j+1) < 2) {
                printf("can't create in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        }
    }
    fprintf(in, "1 1985 1\n");
    fprintf(in, "2 1985 1\n");
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout T+6... ", (unsigned)t/1000);
    LabTimeout = (int)t+6000;
    fflush(stdout);
    LabMemoryLimit = 5000*5000*4+MIN_PROCESS_RSS_BYTES;
    return 0;
}